

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

EntityExpRes __thiscall
xercesc_4_0::SGXMLScanner::scanEntityRef
          (SGXMLScanner *this,bool param_1,XMLCh *firstCh,XMLCh *secondCh,bool *escaped)

{
  ReaderMgr *this_00;
  XMLBufferMgr *this_01;
  XMLSize_t XVar1;
  ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher> *pVVar2;
  bool bVar3;
  XMLBuffer *toFill;
  ulong uVar4;
  char16_t *pcVar5;
  XMLCh *pXVar6;
  XMLCh *text1;
  EntityExpRes EVar7;
  Codes toEmit;
  int colonPosition;
  XMLBufBid bbName;
  XMLCh expLimStr [32];
  int local_8c;
  XMLBuffer *local_88;
  XMLBufferMgr *local_80;
  XMLCh local_78 [36];
  
  *secondCh = L'\0';
  *escaped = false;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  XVar1 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  bVar3 = ReaderMgr::skippedChar(this_00,L'#');
  if (bVar3) {
    bVar3 = XMLScanner::scanCharRef(&this->super_XMLScanner,firstCh,secondCh);
    if (!bVar3) {
      return EntityExp_Failed;
    }
    *escaped = true;
    if (XVar1 == ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      return EntityExp_Returned;
    }
    XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    return EntityExp_Returned;
  }
  this_01 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_01);
  toFill->fIndex = 0;
  local_88 = toFill;
  local_80 = this_01;
  bVar3 = XMLReader::getQName((this->super_XMLScanner).fReaderMgr.fCurReader,toFill,&local_8c);
  if (bVar3) {
    bVar3 = ReaderMgr::skippedChar(this_00,L';');
    if (!bVar3) {
      pXVar6 = toFill->fBuffer;
      pXVar6[toFill->fIndex] = L'\0';
      XMLScanner::emitError
                (&this->super_XMLScanner,UnterminatedEntityRef,pXVar6,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    if (XVar1 != ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum) {
      XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
    }
    pVVar2 = this->fEntityTable;
    pXVar6 = toFill->fBuffer;
    pXVar6[toFill->fIndex] = L'\0';
    bVar3 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::containsKey(pVVar2,pXVar6);
    if (bVar3) {
      if ((this->super_XMLScanner).fSecurityManager != (SecurityManager *)0x0) {
        XVar1 = (this->super_XMLScanner).fEntityExpansionLimit;
        uVar4 = (this->super_XMLScanner).fEntityExpansionCount + 1;
        (this->super_XMLScanner).fEntityExpansionCount = uVar4;
        if (XVar1 < uVar4) {
          XMLString::sizeToText(XVar1,local_78,0x1f,10,(this->super_XMLScanner).fMemoryManager);
          XMLScanner::emitError
                    (&this->super_XMLScanner,EntityExpansionLimitExceeded,local_78,(XMLCh *)0x0,
                     (XMLCh *)0x0,(XMLCh *)0x0);
          (this->super_XMLScanner).fEntityExpansionCount = 0;
        }
      }
      pVVar2 = this->fEntityTable;
      pXVar6 = toFill->fBuffer;
      pXVar6[toFill->fIndex] = L'\0';
      pcVar5 = ValueHashTableOf<char16_t,_xercesc_4_0::StringHasher>::get
                         (pVVar2,pXVar6,XMLPlatformUtils::fgMemoryManager);
      *firstCh = *pcVar5;
      *escaped = true;
      EVar7 = EntityExp_Returned;
      goto LAB_002b5046;
    }
    if (((this->super_XMLScanner).fStandalone == false) &&
       (EVar7 = EntityExp_Failed, (this->super_XMLScanner).fHasNoDTD != true)) goto LAB_002b5046;
    text1 = toFill->fBuffer;
    pXVar6 = text1 + toFill->fIndex;
    toEmit = EntityNotFound;
  }
  else {
    if (toFill->fIndex == 0) {
      EVar7 = EntityExp_Failed;
      XMLScanner::emitError(&this->super_XMLScanner,ExpectedEntityRefName);
      goto LAB_002b5046;
    }
    text1 = toFill->fBuffer;
    pXVar6 = text1 + toFill->fIndex;
    toEmit = InvalidEntityRefName;
  }
  *pXVar6 = L'\0';
  EVar7 = EntityExp_Failed;
  XMLScanner::emitError(&this->super_XMLScanner,toEmit,text1,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0)
  ;
LAB_002b5046:
  XMLBufferMgr::releaseBuffer(this_01,toFill);
  return EVar7;
}

Assistant:

SGXMLScanner::EntityExpRes
SGXMLScanner::scanEntityRef(  const   bool
                            ,       XMLCh&  firstCh
                            ,       XMLCh&  secondCh
                            ,       bool&   escaped)
{
    // Assume no escape
    secondCh = 0;
    escaped = false;

    // We have to insure that its all in one entity
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    //  If the next char is a pound, then its a character reference and we
    //  need to expand it always.
    if (fReaderMgr.skippedChar(chPound))
    {
        //  Its a character reference, so scan it and get back the numeric
        //  value it represents.
        if (!scanCharRef(firstCh, secondCh))
            return EntityExp_Failed;

        escaped = true;

        if (curReader != fReaderMgr.getCurrentReaderNum())
            emitError(XMLErrs::PartialMarkupInEntity);

        return EntityExp_Returned;
    }

    // Expand it since its a normal entity ref
    XMLBufBid bbName(&fBufMgr);
    int colonPosition;
    if (!fReaderMgr.getQName(bbName.getBuffer(), &colonPosition))
    {
        if (bbName.isEmpty())
            emitError(XMLErrs::ExpectedEntityRefName);
        else
            emitError(XMLErrs::InvalidEntityRefName, bbName.getRawBuffer());
        return EntityExp_Failed;
    }

    //  Next char must be a semi-colon. But if its not, just emit
    //  an error and try to continue.
    if (!fReaderMgr.skippedChar(chSemiColon))
        emitError(XMLErrs::UnterminatedEntityRef, bbName.getRawBuffer());

    // Make sure we ended up on the same entity reader as the & char
    if (curReader != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialMarkupInEntity);

    // Look up the name in the general entity pool
    // If it does not exist, then obviously an error
    if (!fEntityTable->containsKey(bbName.getRawBuffer()))
    {
        // XML 1.0 Section 4.1
        // Well-formedness Constraint for entity not found:
        //   In a document without any DTD, a document with only an internal DTD subset which contains no parameter entity references,
        //      or a document with "standalone='yes'", for an entity reference that does not occur within the external subset
        //      or a parameter entity
        if (fStandalone || fHasNoDTD)
            emitError(XMLErrs::EntityNotFound, bbName.getRawBuffer());

        return EntityExp_Failed;
    }

    // here's where we need to check if there's a SecurityManager,
    // how many entity references we've had
    if(fSecurityManager != 0 && ++fEntityExpansionCount > fEntityExpansionLimit) {
        XMLCh expLimStr[32];
        XMLString::sizeToText(fEntityExpansionLimit, expLimStr, 31, 10, fMemoryManager);
        emitError
        (
            XMLErrs::EntityExpansionLimitExceeded
            , expLimStr
        );
        // there seems nothing better to be done than to reset the entity expansion limit
        fEntityExpansionCount = 0;
    }

    firstCh = fEntityTable->get(bbName.getRawBuffer());
    escaped = true;
    return EntityExp_Returned;
}